

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::HistogramFun::GetFunctions(void)

{
  long lVar1;
  undefined8 *puVar2;
  AggregateFunctionSet *in_RDI;
  undefined8 *puVar3;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  AggregateFunction histogram_function;
  allocator_type local_421;
  LogicalType local_420 [24];
  LogicalType local_408 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3f0;
  string local_3d8;
  undefined1 local_3b8 [176];
  undefined8 auStack_308 [14];
  element_type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  undefined1 local_288 [176];
  undefined8 auStack_1d8 [14];
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined **local_158 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  bVar4 = 0;
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"histogram","");
  duckdb::LogicalType::LogicalType(local_408,ANY);
  __l._M_len = 1;
  __l._M_array = local_408;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3f0,__l,&local_421);
  duckdb::LogicalType::LogicalType(local_420,MAP);
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_288,&local_3d8,
             (vector<duckdb::LogicalType,_true> *)&local_3f0,local_420,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,HistogramBindFunction<true>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(local_420);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f0);
  duckdb::LogicalType::~LogicalType(local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  BinnedHistogramFunction();
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),(AggregateFunction *)local_158);
  local_158[0] = &PTR__AggregateFunction_00897e98;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_3b8,(SimpleFunction *)local_288);
  local_3b8._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType
            ((LogicalType *)(local_3b8 + 0x90),(LogicalType *)(local_288 + 0x90));
  local_3b8._168_4_ = local_288._168_4_;
  local_3b8._0_8_ = &PTR__AggregateFunction_00897e98;
  puVar2 = auStack_1d8;
  puVar3 = auStack_308;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  auStack_308[0xd]._0_1_ = (AggregateOrderDependent)auStack_1d8[0xd];
  auStack_308[0xd]._1_1_ = auStack_1d8[0xd]._1_1_;
  local_298 = local_168;
  local_290._M_pi = local_160._M_pi;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),(AggregateFunction *)local_3b8);
  local_3b8._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3b8);
  local_288._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_288);
  return;
}

Assistant:

AggregateFunctionSet HistogramFun::GetFunctions() {
	AggregateFunctionSet fun;
	AggregateFunction histogram_function("histogram", {LogicalType::ANY}, LogicalTypeId::MAP, nullptr, nullptr, nullptr,
	                                     nullptr, nullptr, nullptr, HistogramBindFunction, nullptr);
	fun.AddFunction(HistogramFun::BinnedHistogramFunction());
	fun.AddFunction(histogram_function);
	return fun;
}